

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O3

Spectrum __thiscall CMU462::PathTracer::raytrace_pixel(PathTracer *this,size_t x,size_t y)

{
  Spectrum SVar1;
  Ray local_80;
  
  Camera::generate_ray(&local_80,this->camera,0.5,0.5);
  SVar1 = trace_ray(this,&local_80);
  return SVar1;
}

Assistant:

Spectrum PathTracer::raytrace_pixel(size_t x, size_t y) {

    // TODO:
    // Sample the pixel with coordinate (x,y) and return the result spectrum.
    // The sample rate is given by the number of camera rays per pixel.

    int num_samples = ns_aa;

    Vector2D p = Vector2D(0.5,0.5);
    return trace_ray(camera->generate_ray(p.x, p.y));

  }